

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  bool local_91;
  int comp;
  allocator local_61;
  string local_60;
  char *local_40;
  char *other_str;
  char *this_str;
  uint local_28;
  uint other_len;
  uint this_len;
  int temp;
  Value *other_local;
  Value *this_local;
  
  other_len = (uint)(*(ushort *)&other->field_0x8 & 0xff);
  if ((*(ushort *)&this->field_0x8 & 0xff) == other_len) {
    _this_len = other;
    other_local = this;
    switch(this->field_0x8) {
    case 0:
      this_local._7_1_ = true;
      break;
    case 1:
      this_local._7_1_ = (this->value_).int_ == (other->value_).int_;
      break;
    case 2:
      this_local._7_1_ = (this->value_).int_ == (other->value_).int_;
      break;
    case 3:
      this_local._7_1_ = (this->value_).real_ == (other->value_).real_;
      break;
    case 4:
      if (((this->value_).int_ == 0) || ((other->value_).int_ == 0)) {
        this_local._7_1_ = (this->value_).int_ == (other->value_).int_;
      }
      else {
        decodePrefixedString
                  ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0,(this->value_).string_,&local_28,
                   &other_str);
        decodePrefixedString
                  ((*(ushort *)&_this_len->field_0x8 >> 8 & 1) != 0,(_this_len->value_).string_,
                   (uint *)((long)&this_str + 4),&local_40);
        if (local_28 == this_str._4_4_) {
          if ((other_str == (char *)0x0) || (local_40 == (char *)0x0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_60,"assert json failed",&local_61);
            throwLogicError(&local_60);
          }
          iVar1 = memcmp(other_str,local_40,(ulong)local_28);
          this_local._7_1_ = iVar1 == 0;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      break;
    case 5:
      this_local._7_1_ = ((this->value_).bool_ & 1U) == ((other->value_).bool_ & 1U);
      break;
    case 6:
    case 7:
      sVar2 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((this->value_).map_);
      sVar3 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((_this_len->value_).map_);
      local_91 = false;
      if (sVar2 == sVar3) {
        local_91 = std::operator==((this->value_).map_,(_this_len->value_).map_);
      }
      this_local._7_1_ = local_91;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kong36088[P]LeetCodeLib/lib/jsoncpp.cpp"
                    ,0xc0b,"bool Json::Value::operator==(const Value &) const");
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::operator==(const Value& other) const {
  // if ( type_ != other.type_ )
  // GCC 2.95.3 says:
  // attempt to take address of bit-field structure member `Json::Value::type_'
  // Beats me, but a temp solves the problem.
  int temp = other.type_;
  if (type_ != temp)
    return false;
  switch (type_) {
  case nullValue:
    return true;
  case intValue:
    return value_.int_ == other.value_.int_;
  case uintValue:
    return value_.uint_ == other.value_.uint_;
  case realValue:
    return value_.real_ == other.value_.real_;
  case booleanValue:
    return value_.bool_ == other.value_.bool_;
  case stringValue:
  {
    if ((value_.string_ == 0) || (other.value_.string_ == 0)) {
      return (value_.string_ == other.value_.string_);
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    decodePrefixedString(other.allocated_, other.value_.string_, &other_len, &other_str);
    if (this_len != other_len) return false;
    JSON_ASSERT(this_str && other_str);
    int comp = memcmp(this_str, other_str, this_len);
    return comp == 0;
  }
  case arrayValue:
  case objectValue:
    return value_.map_->size() == other.value_.map_->size() &&
           (*value_.map_) == (*other.value_.map_);
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}